

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O0

void __thiscall CP::list<int>::print(list<int> *this)

{
  bool bVar1;
  ostream *poVar2;
  void *this_00;
  int *piVar3;
  list_iterator local_30;
  list_iterator local_28;
  iterator it;
  iterator before;
  int i;
  list<int> *this_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout," Size = ");
  this_00 = (void *)std::ostream::operator<<(poVar2,this->mSize);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout," Header address = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->mHeader);
  poVar2 = std::operator<<(poVar2," (prev = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->mHeader->prev);
  poVar2 = std::operator<<(poVar2," next = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->mHeader->next);
  poVar2 = std::operator<<(poVar2,")");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  before.ptr._4_4_ = 0;
  list_iterator::list_iterator(&it);
  local_28.ptr = (node *)begin(this);
  while( true ) {
    local_30.ptr = (node *)end(this);
    bVar1 = list_iterator::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    poVar2 = std::operator<<((ostream *)&std::cout,"Node ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,before.ptr._4_4_);
    poVar2 = std::operator<<(poVar2,": ");
    piVar3 = list_iterator::operator*(&local_28);
    std::ostream::operator<<(poVar2,*piVar3);
    poVar2 = std::operator<<((ostream *)&std::cout," (prev = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(local_28.ptr)->prev);
    poVar2 = std::operator<<(poVar2,", I\'m at ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_28.ptr);
    poVar2 = std::operator<<(poVar2,", next = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(local_28.ptr)->next);
    poVar2 = std::operator<<(poVar2,")");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    it.ptr = local_28.ptr;
    list_iterator::operator++(&local_28,0);
    before.ptr._4_4_ = before.ptr._4_4_ + 1;
  }
  return;
}

Assistant:

void print() {
      std::cout << " Size = " << mSize << std::endl;
      std::cout << " Header address = " << (mHeader) << " (prev = " << mHeader->prev << " next = " << mHeader->next << ")" << std::endl;
      int i = 0;
      iterator before;
      for (iterator it = begin();it!=end();before = it, it++,i++) {
        std::cout << "Node " << i << ": " << *it;
        std::cout << " (prev = " << it.ptr->prev << ", I'm at " << it.ptr << ", next = " << it.ptr->next << ")" <<  std:: endl;
      }
    }